

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::~SubstitutionTreeClauseVariantIndex
          (SubstitutionTreeClauseVariantIndex *this)

{
  ZIArray<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *this_00;
  Entry *pEVar1;
  uint uVar2;
  Clause *pCVar3;
  Entry *pEVar4;
  Clause *pCVar5;
  LiteralSubstitutionTree<Indexing::LiteralClause> *pLVar6;
  Entry *pEVar7;
  ulong uVar8;
  ulong n;
  
  (this->super_ClauseVariantIndex)._vptr_ClauseVariantIndex =
       (_func_int **)&PTR__SubstitutionTreeClauseVariantIndex_00b28118;
  this_00 = &this->_strees;
  uVar8 = (ulong)(uint)(this->_strees).
                       super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
                       _capacity;
  if (uVar8 != 0) {
    n = 0;
    do {
      if ((this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
          _capacity <= n) {
        Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
                  (&this_00->
                    super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n);
      }
      pLVar6 = (this->_strees).
               super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>._array[n];
      if (pLVar6 != (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
        if ((this->_strees).
            super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>._capacity <= n
           ) {
          Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
                    (&this_00->
                      super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n);
          pLVar6 = (this->_strees).
                   super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>._array
                   [n];
          if (pLVar6 == (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) goto LAB_002bb4c3;
        }
        (*(pLVar6->super_LiteralIndexingStructure<Indexing::LiteralClause>).
          _vptr_LiteralIndexingStructure[1])();
      }
LAB_002bb4c3:
      n = n + 1;
    } while (uVar8 != n);
  }
  pCVar3 = (Clause *)this->_emptyClauses;
  while (pCVar5 = pCVar3, pCVar5 != (Clause *)0x0) {
    pCVar3 = *(Clause **)&(pCVar5->super_Unit)._inference;
    *(undefined8 *)&pCVar5->super_Unit = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar5;
  }
  pEVar7 = (this->_groundUnits)._entries;
  pEVar4 = (this->_groundUnits)._afterLast;
  if (pEVar7 != pEVar4) {
    uVar2 = (this->_groundUnits)._timestamp;
    do {
      pEVar1 = pEVar7 + 1;
      if (((pEVar7->field_0)._infoData & 1U) == 0 && (uint)(pEVar7->field_0)._infoData >> 2 == uVar2
         ) {
        pCVar3 = (Clause *)pEVar7->_val;
        while (pCVar5 = pCVar3, pCVar5 != (Clause *)0x0) {
          pCVar3 = *(Clause **)&(pCVar5->super_Unit)._inference;
          *(undefined8 *)&pCVar5->super_Unit = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar5;
        }
      }
      pEVar7 = pEVar1;
    } while (pEVar1 != pEVar4);
  }
  Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::~Array
            (&this_00->super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>);
  Lib::DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_groundUnits);
  return;
}

Assistant:

SubstitutionTreeClauseVariantIndex::~SubstitutionTreeClauseVariantIndex()
{
  unsigned streeArrSz=_strees.size();
  for(unsigned i=0;i<streeArrSz;i++) {
    if(_strees[i]!=0) {
      delete _strees[i];
    }
  }

  ClauseList::destroy(_emptyClauses);

  DHMap<Literal*, ClauseList*>::Iterator it(_groundUnits);
  while (it.hasNext()) {
    ClauseList::destroy(it.next());
  }
}